

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_test.cc
# Opt level: O2

void leveldb::RunConcurrent(int run)

{
  int iVar1;
  Env *pEVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  Random rnd;
  TestState state;
  
  iVar1 = test::RandomSeed();
  uVar3 = run * 100 + iVar1;
  rnd.seed_ = uVar3 & 0x7fffffff;
  if ((rnd.seed_ == 0x7fffffff) || (rnd.seed_ == 0)) {
    rnd.seed_ = 1;
  }
  for (uVar4 = 0; uVar4 != 1000; uVar4 = uVar4 + 1) {
    if ((short)((uVar4 & 0xffff) % 100) == 0) {
      fprintf(_stderr,"Run %d of %d\n",(ulong)uVar4,1000);
    }
    TestState::TestState(&state,uVar3 + 1);
    pEVar2 = Env::Default();
    (*pEVar2->_vptr_Env[0xf])(pEVar2,ConcurrentReader,&state);
    TestState::Wait(&state,RUNNING);
    iVar1 = 1000;
    while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
      ConcurrentTest::WriteStep(&state.t_,&rnd);
    }
    state.quit_flag_._M_base._M_i = (__atomic_base<bool>)true;
    TestState::Wait(&state,DONE);
    TestState::~TestState(&state);
  }
  return;
}

Assistant:

static void RunConcurrent(int run) {
  const int seed = test::RandomSeed() + (run * 100);
  Random rnd(seed);
  const int N = 1000;
  const int kSize = 1000;
  for (int i = 0; i < N; i++) {
    if ((i % 100) == 0) {
      fprintf(stderr, "Run %d of %d\n", i, N);
    }
    TestState state(seed + 1);
    Env::Default()->Schedule(ConcurrentReader, &state);
    state.Wait(TestState::RUNNING);
    for (int i = 0; i < kSize; i++) {
      state.t_.WriteStep(&rnd);
    }
    state.quit_flag_.store(true, std::memory_order_release);
    state.Wait(TestState::DONE);
  }
}